

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O2

void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  uint uVar1;
  int type;
  size_t sVar2;
  uchar *puVar3;
  LogContext *ctx;
  long *plVar4;
  int iVar5;
  uint32_t uVar6;
  PktOut *pkt;
  undefined4 extraout_var;
  char *texttype;
  int iVar7;
  size_t len;
  ptrlen pkt_00;
  ptrlen data;
  int local_7c;
  PacketQueueBase *local_78;
  undefined8 local_70;
  logblank_t blanks [4];
  
  if (*(char *)&bpp[-1].ic_out_pq.ctx == '\0') {
    local_78 = &(bpp->out_pq).pqb;
    do {
      pkt = (*(bpp->out_pq).after)(local_78,&local_78->end,true);
      if (pkt == (PktOut *)0x0) goto LAB_0011b8e1;
      type = pkt->type;
      if (bpp->logctx != (LogContext *)0x0) {
        sVar2 = pkt->prefix;
        puVar3 = pkt->data;
        len = pkt->length - sVar2;
        pkt_00.len = len;
        pkt_00.ptr = puVar3 + sVar2;
        iVar5 = ssh1_censor_packet(bpp->pls,type,true,pkt_00,blanks);
        local_70 = CONCAT44(extraout_var,iVar5);
        ctx = bpp->logctx;
        iVar5 = pkt->type;
        texttype = ssh1_pkt_type(iVar5);
        log_packet(ctx,1,iVar5,texttype,puVar3 + sVar2,len,(int)local_70,blanks,(unsigned_long *)0x0
                   ,0,(char *)0x0);
      }
      plVar4 = *(long **)&bpp[-1].ic_out_pq.queued;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x20))
                  (plVar4,pkt->data + 0xc,(int)pkt->length + -0xc,blanks,&local_7c,0);
        pkt->length = 0xc;
        BinarySink_put_data(pkt->binarysink_,(void *)blanks[0]._0_8_,(long)local_7c);
        safefree((void *)blanks[0]._0_8_);
      }
      BinarySink_put_uint32(pkt->binarysink_,0);
      iVar5 = (int)pkt->length;
      uVar1 = iVar5 - 0xc;
      iVar7 = (int)uVar1 % 8;
      iVar5 = iVar5 - iVar7;
      random_read(pkt->data + iVar7,(ulong)(0xc - iVar7));
      data.ptr = pkt->data + (long)iVar7 + 4;
      data.len = (size_t)(iVar5 + -8);
      uVar6 = crc32_ssh1(data);
      *(uint32_t *)(pkt->data + (long)(iVar5 + -4) + (long)iVar7) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      *(uint *)(pkt->data + iVar7) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000;
      plVar4 = (long *)bpp[-1].ic_in_raw.ctx;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x20))(plVar4,pkt->data + (long)iVar7 + 4,iVar5 + -4);
      }
      bufchain_add(bpp->out_raw,pkt->data + iVar7,(long)iVar5);
      ssh_free_pktout(pkt);
    } while (type != 0x25);
    *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 1;
LAB_0011b8e1:
    ssh_sendbuffer_changed(bpp->ssh);
  }
  return;
}

Assistant:

static void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);
    PktOut *pkt;

    if (s->pending_compression_request) {
        /*
         * Don't send any output packets while we're awaiting a
         * response to SSH1_CMSG_REQUEST_COMPRESSION, because if they
         * cross over in transit with the responding SSH1_CMSG_SUCCESS
         * then the other end could decode them with the wrong
         * compression settings.
         */
        return;
    }

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        int type = pkt->type;
        ssh1_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);

        if (type == SSH1_CMSG_REQUEST_COMPRESSION) {
            /*
             * When we see the actual compression request go past, set
             * the pending flag, and stop processing packets this
             * time.
             */
            s->pending_compression_request = true;
            break;
        }
    }

    ssh_sendbuffer_changed(bpp->ssh);
}